

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_load.cpp
# Opt level: O2

void duckdb::ExtensionHelper::LoadExternalExtension
               (DatabaseInstance *db,FileSystem *fs,string *extension)

{
  bool bVar1;
  char cVar2;
  code *pcVar3;
  type pEVar4;
  IOException *pIVar5;
  FatalException *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> init_fun_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fa0;
  ExtensionInitResult extension_init_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ea8 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e08;
  duckdb_extension_access access;
  ErrorData error;
  bool local_b0;
  ErrorData local_a8;
  
  bVar1 = DatabaseInstance::ExtensionIsLoaded(db,extension);
  if (!bVar1) {
    InitialLoad(&extension_init_result,db,fs,extension);
    if (extension_init_result.abi_type == CPP) {
      ::std::operator+(&init_fun_name,&extension_init_result.filebase,"_init");
      pcVar3 = (code *)dlsym(extension_init_result.lib_hdl,init_fun_name._M_dataplus._M_p);
      if (pcVar3 == (code *)0x0) {
        pIVar5 = (IOException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&error,
                   "Extension \'%s\' did not contain the expected entrypoint function \'%s\'",
                   (allocator *)&local_fc0);
        ::std::__cxx11::string::string((string *)&local_e08,(string *)extension);
        ::std::__cxx11::string::string((string *)&local_e28,(string *)&init_fun_name);
        IOException::IOException<std::__cxx11::string,std::__cxx11::string>
                  (pIVar5,(string *)&error,&local_e08,&local_e28);
        __cxa_throw(pIVar5,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      (*pcVar3)(db);
      pEVar4 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
               ::operator*(&extension_init_result.install_info);
      DatabaseInstance::SetExtensionLoaded(db,extension,pEVar4);
    }
    else {
      if ((extension_init_result.abi_type & ~CPP) != C_STRUCT) {
        pIVar5 = (IOException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&error,"Unknown ABI type of value \'%s\' for extension \'%s\'",
                   (allocator *)&init_fun_name);
        ::std::__cxx11::string::string((string *)&local_f28,(string *)extension);
        IOException::IOException<unsigned_char,std::__cxx11::string>
                  (pIVar5,(string *)&error,extension_init_result.abi_type,&local_f28);
        __cxa_throw(pIVar5,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::operator+(&init_fun_name,&extension_init_result.filebase,"_init_c_api");
      pcVar3 = (code *)dlsym(extension_init_result.lib_hdl,init_fun_name._M_dataplus._M_p);
      if (pcVar3 == (code *)0x0) {
        pIVar5 = (IOException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&error,"File \"%s\" did not contain function \"%s\": %s",
                   (allocator *)&local_fc0);
        ::std::__cxx11::string::string((string *)local_ea8,(string *)&extension_init_result);
        ::std::__cxx11::string::string((string *)&local_ec8,(string *)&init_fun_name);
        GetDLError_abi_cxx11_();
        IOException::IOException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (pIVar5,(string *)&error,local_ea8,&local_ec8,&local_ee8);
        __cxa_throw(pIVar5,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      DuckDBExtensionLoadState::DuckDBExtensionLoadState
                ((DuckDBExtensionLoadState *)&error,db,&extension_init_result);
      access.set_error = ExtensionAccess::SetError;
      access.get_database = ExtensionAccess::GetDatabase;
      access.get_api = ExtensionAccess::GetAPI;
      cVar2 = (*pcVar3)(&error);
      if (local_b0 == true) {
        ::std::operator+(&local_fa0,"An error was thrown during initialization of the extension \'",
                         extension);
        ::std::operator+(&local_fc0,&local_fa0,"\': ");
        ErrorData::Throw(&local_a8,(string *)&local_fc0);
      }
      if (cVar2 == '\0') {
        this = (FatalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_fc0,
                   "Extension \'%s\' failed to initialize but did not return an error. This indicates an error in the extension: C API extensions should return a boolean `true` to indicate succesful initialization. This means that the Extension may be partially initialized resulting in an inconsistent state of DuckDB."
                   ,(allocator *)&local_fa0);
        ::std::__cxx11::string::string((string *)&local_f08,(string *)extension);
        FatalException::FatalException<std::__cxx11::string>(this,&local_fc0,&local_f08);
        __cxa_throw(this,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pEVar4 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
               ::operator*(&extension_init_result.install_info);
      DatabaseInstance::SetExtensionLoaded(db,extension,pEVar4);
      DuckDBExtensionLoadState::~DuckDBExtensionLoadState((DuckDBExtensionLoadState *)&error);
    }
    ::std::__cxx11::string::~string((string *)&init_fun_name);
    ExtensionInitResult::~ExtensionInitResult(&extension_init_result);
  }
  return;
}

Assistant:

void ExtensionHelper::LoadExternalExtension(DatabaseInstance &db, FileSystem &fs, const string &extension) {
	if (db.ExtensionIsLoaded(extension)) {
		return;
	}
#ifdef DUCKDB_DISABLE_EXTENSION_LOAD
	throw PermissionException("Loading external extensions is disabled through a compile time flag");
#else
	auto extension_init_result = InitialLoad(db, fs, extension);

	// C++ ABI
	if (extension_init_result.abi_type == ExtensionABIType::CPP) {
		auto init_fun_name = extension_init_result.filebase + "_init";
		ext_init_fun_t init_fun = TryLoadFunctionFromDLL<ext_init_fun_t>(extension_init_result.lib_hdl, init_fun_name,
		                                                                 extension_init_result.filename);
		if (!init_fun) {
			throw IOException("Extension '%s' did not contain the expected entrypoint function '%s'", extension,
			                  init_fun_name);
		}

		try {
			(*init_fun)(db);
		} catch (std::exception &e) {
			ErrorData error(e);
			throw InvalidInputException("Initialization function \"%s\" from file \"%s\" threw an exception: \"%s\"",
			                            init_fun_name, extension_init_result.filename, error.RawMessage());
		}

		D_ASSERT(extension_init_result.install_info);

		db.SetExtensionLoaded(extension, *extension_init_result.install_info);
		return;
	}

	// C ABI
	if (extension_init_result.abi_type == ExtensionABIType::C_STRUCT ||
	    extension_init_result.abi_type == ExtensionABIType::C_STRUCT_UNSTABLE) {
		auto init_fun_name = extension_init_result.filebase + "_init_c_api";
		ext_init_c_api_fun_t init_fun_capi = TryLoadFunctionFromDLL<ext_init_c_api_fun_t>(
		    extension_init_result.lib_hdl, init_fun_name, extension_init_result.filename);

		if (!init_fun_capi) {
			throw IOException("File \"%s\" did not contain function \"%s\": %s", extension_init_result.filename,
			                  init_fun_name, GetDLError());
		}
		// Create the load state
		DuckDBExtensionLoadState load_state(db, extension_init_result);

		auto access = ExtensionAccess::CreateAccessStruct();
		auto result = (*init_fun_capi)(load_state.ToCStruct(), &access);

		// Throw any error that the extension might have encountered
		if (load_state.has_error) {
			load_state.error_data.Throw("An error was thrown during initialization of the extension '" + extension +
			                            "': ");
		}

		// Extensions are expected to either set an error or return true indicating successful initialization
		if (result == false) {
			throw FatalException(
			    "Extension '%s' failed to initialize but did not return an error. This indicates an "
			    "error in the extension: C API extensions should return a boolean `true` to indicate succesful "
			    "initialization. "
			    "This means that the Extension may be partially initialized resulting in an inconsistent state of "
			    "DuckDB.",
			    extension);
		}

		D_ASSERT(extension_init_result.install_info);

		db.SetExtensionLoaded(extension, *extension_init_result.install_info);
		return;
	}

	throw IOException("Unknown ABI type of value '%s' for extension '%s'",
	                  static_cast<uint8_t>(extension_init_result.abi_type), extension);
#endif
}